

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

ctrl_t * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
::control(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *this)

{
  bool bVar1;
  CommonFields *this_00;
  ctrl_t *pcVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x1017,
                  "ctrl_t *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::control() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  this_00 = common(this);
  pcVar2 = CommonFields::control(this_00);
  return pcVar2;
}

Assistant:

ctrl_t* control() const {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return common().control();
  }